

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.cpp
# Opt level: O0

void __thiscall ChaCha20Aligned::Keystream(ChaCha20Aligned *this,Span<std::byte> output)

{
  long lVar1;
  size_t sVar2;
  Span<std::byte> *this_00;
  Span<std::byte> *pSVar3;
  uchar *in_RDI;
  long in_FS_OFFSET;
  uint32_t j15;
  uint32_t j14;
  uint32_t j13;
  uint32_t j12;
  uint32_t j11;
  uint32_t j10;
  uint32_t j9;
  uint32_t j8;
  uint32_t j7;
  uint32_t j6;
  uint32_t j5;
  uint32_t j4;
  uint32_t x15;
  uint32_t x14;
  uint32_t x13;
  uint32_t x12;
  uint32_t x11;
  uint32_t x10;
  uint32_t x9;
  uint32_t x8;
  uint32_t x7;
  uint32_t x6;
  uint32_t x5;
  uint32_t x4;
  uint32_t x3;
  uint32_t x2;
  uint32_t x1;
  uint32_t x0;
  size_t blocks;
  uchar *c;
  Span<std::byte> *in_stack_ffffffffffffff48;
  int local_98;
  int local_94;
  ulong local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Span<std::byte>::data(in_stack_ffffffffffffff48);
  UCharCast((byte *)in_stack_ffffffffffffff48);
  sVar2 = Span<std::byte>::size(in_stack_ffffffffffffff48);
  local_30 = sVar2 >> 6;
  this_00 = (Span<std::byte> *)(local_30 << 6);
  pSVar3 = (Span<std::byte> *)Span<std::byte>::size(this_00);
  if (this_00 != pSVar3) {
    __assert_fail("blocks * BLOCKLEN == output.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0x40,"void ChaCha20Aligned::Keystream(Span<std::byte>)");
  }
  if (local_30 != 0) {
    local_94 = *(int *)(in_RDI + 0x20);
    local_98 = *(int *)(in_RDI + 0x24);
    while( true ) {
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      std::rotl<unsigned_int>((uint)((ulong)this_00 >> 0x20),(int)this_00);
      local_94 = local_94 + 1;
      if (local_94 == 0) {
        local_98 = local_98 + 1;
      }
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      WriteLE32(in_RDI,(uint32_t)((ulong)this_00 >> 0x20));
      if (local_30 == 1) break;
      local_30 = local_30 - 1;
    }
    *(int *)(in_RDI + 0x20) = local_94;
    *(int *)(in_RDI + 0x24) = local_98;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void ChaCha20Aligned::Keystream(Span<std::byte> output) noexcept
{
    unsigned char* c = UCharCast(output.data());
    size_t blocks = output.size() / BLOCKLEN;
    assert(blocks * BLOCKLEN == output.size());

    uint32_t x0, x1, x2, x3, x4, x5, x6, x7, x8, x9, x10, x11, x12, x13, x14, x15;
    uint32_t j4, j5, j6, j7, j8, j9, j10, j11, j12, j13, j14, j15;

    if (!blocks) return;

    j4 = input[0];
    j5 = input[1];
    j6 = input[2];
    j7 = input[3];
    j8 = input[4];
    j9 = input[5];
    j10 = input[6];
    j11 = input[7];
    j12 = input[8];
    j13 = input[9];
    j14 = input[10];
    j15 = input[11];

    for (;;) {
        x0 = 0x61707865;
        x1 = 0x3320646e;
        x2 = 0x79622d32;
        x3 = 0x6b206574;
        x4 = j4;
        x5 = j5;
        x6 = j6;
        x7 = j7;
        x8 = j8;
        x9 = j9;
        x10 = j10;
        x11 = j11;
        x12 = j12;
        x13 = j13;
        x14 = j14;
        x15 = j15;

        // The 20 inner ChaCha20 rounds are unrolled here for performance.
        REPEAT10(
            QUARTERROUND( x0, x4, x8,x12);
            QUARTERROUND( x1, x5, x9,x13);
            QUARTERROUND( x2, x6,x10,x14);
            QUARTERROUND( x3, x7,x11,x15);
            QUARTERROUND( x0, x5,x10,x15);
            QUARTERROUND( x1, x6,x11,x12);
            QUARTERROUND( x2, x7, x8,x13);
            QUARTERROUND( x3, x4, x9,x14);
        );

        x0 += 0x61707865;
        x1 += 0x3320646e;
        x2 += 0x79622d32;
        x3 += 0x6b206574;
        x4 += j4;
        x5 += j5;
        x6 += j6;
        x7 += j7;
        x8 += j8;
        x9 += j9;
        x10 += j10;
        x11 += j11;
        x12 += j12;
        x13 += j13;
        x14 += j14;
        x15 += j15;

        ++j12;
        if (!j12) ++j13;

        WriteLE32(c + 0, x0);
        WriteLE32(c + 4, x1);
        WriteLE32(c + 8, x2);
        WriteLE32(c + 12, x3);
        WriteLE32(c + 16, x4);
        WriteLE32(c + 20, x5);
        WriteLE32(c + 24, x6);
        WriteLE32(c + 28, x7);
        WriteLE32(c + 32, x8);
        WriteLE32(c + 36, x9);
        WriteLE32(c + 40, x10);
        WriteLE32(c + 44, x11);
        WriteLE32(c + 48, x12);
        WriteLE32(c + 52, x13);
        WriteLE32(c + 56, x14);
        WriteLE32(c + 60, x15);

        if (blocks == 1) {
            input[8] = j12;
            input[9] = j13;
            return;
        }
        blocks -= 1;
        c += BLOCKLEN;
    }
}